

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_RepeatedFieldMapTest_CustomIndexMapKeyComparator_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldMapTest_CustomIndexMapKeyComparator_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  void *pvVar3;
  FieldDescriptor *field;
  Arena *pAVar4;
  char *message;
  char *in_R9;
  pointer *__ptr;
  string_view value;
  string_view value_00;
  string_view value_01;
  OffsetByOneMapKeyComparator key_comparator;
  string output;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  MessageDifferencer differencer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3a0;
  Message local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_390;
  MapKeyComparator local_388;
  AssertHelper local_380;
  string local_378;
  undefined1 local_358 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined1 local_338 [184];
  undefined1 local_280 [184];
  MessageDifferencer local_1c8;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_338,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_280,(Arena *)0x0);
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_338 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 1;
  pAVar4 = *(Arena **)((long)pvVar3 + 8);
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  value._M_str = "one";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar3 + 0x88),value,pAVar4);
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_280 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 1;
  pAVar4 = *(Arena **)((long)pvVar3 + 8);
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  value_00._M_str = "zero";
  value_00._M_len = 4;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar3 + 0x88),value_00,pAVar4);
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_280 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 1;
  pAVar4 = *(Arena **)((long)pvVar3 + 8);
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  value_01._M_str = "one";
  value_01._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar3 + 0x88),value_01,pAVar4);
  util::MessageDifferencer::MessageDifferencer(&local_1c8);
  util::MessageDifferencer::MapKeyComparator::MapKeyComparator(&local_388);
  local_388._vptr_MapKeyComparator = (_func_int **)&PTR__MapKeyComparator_018f23d8;
  paVar1 = &local_378.field_2;
  local_378._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"item","");
  field = GetFieldDescriptor((anon_unknown_0 *)local_338,(Message *)local_378._M_dataplus._M_p,
                             (string *)local_378._M_string_length);
  util::MessageDifferencer::TreatAsMapUsingKeyComparator(&local_1c8,field,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar1) {
    operator_delete(local_378._M_dataplus._M_p,
                    CONCAT71(local_378.field_2._M_allocated_capacity._1_7_,
                             local_378.field_2._M_local_buf[0]) + 1);
  }
  local_378._M_string_length = 0;
  local_378.field_2._M_local_buf[0] = '\0';
  local_378._M_dataplus._M_p = (pointer)paVar1;
  util::MessageDifferencer::ReportDifferencesToString(&local_1c8,&local_378);
  bVar2 = util::MessageDifferencer::Compare(&local_1c8,(Message *)local_338,(Message *)local_280);
  local_398.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar2;
  local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_398,(AssertionResult *)0x122213d,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9cc,(char *)CONCAT71(local_358._1_7_,local_358[0]));
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_358._1_7_,local_358[0]) != &local_348) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_358._1_7_,local_358[0]),local_348._M_allocated_capacity + 1)
      ;
    }
    if (local_3a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3a0._M_head_impl + 8))();
    }
    if (local_390 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_390,local_390);
    }
  }
  testing::internal::CmpHelperEQ<char[72],std::__cxx11::string>
            ((internal *)local_358,
             "\"moved: item[0] -> item[1] : { b: \\\"one\\\" }\\n\" \"added: item[0]: { b: \\\"zero\\\" }\\n\""
             ,"output",
             (char (*) [72])
             "moved: item[0] -> item[1] : { b: \"one\" }\nadded: item[0]: { b: \"zero\" }\n",
             &local_378);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message(&local_398);
    if (local_350 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_350->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9d0,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if ((long *)CONCAT71(local_398.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_398.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_398.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_398.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_350 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_350,local_350);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != paVar1) {
    operator_delete(local_378._M_dataplus._M_p,
                    CONCAT71(local_378.field_2._M_allocated_capacity._1_7_,
                             local_378.field_2._M_local_buf[0]) + 1);
  }
  util::MessageDifferencer::MapKeyComparator::~MapKeyComparator(&local_388);
  util::MessageDifferencer::~MessageDifferencer(&local_1c8);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_280);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_338);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldMapTest_CustomIndexMapKeyComparator) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  // Treat "item" as Map, using custom key comparator to determine if two
  // elements have the same key.
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  item->set_b("one");
  item = msg2.add_item();
  item->set_b("zero");
  item = msg2.add_item();
  item->set_b("one");
  util::MessageDifferencer differencer;
  OffsetByOneMapKeyComparator key_comparator;
  differencer.TreatAsMapUsingKeyComparator(GetFieldDescriptor(msg1, "item"),
                                           &key_comparator);
  std::string output;
  differencer.ReportDifferencesToString(&output);
  // With the offset by one comparator msg1.item[0] should be compared to
  // msg2.item[1] and thus be moved, msg2.item[0] should be marked as added.
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "moved: item[0] -> item[1] : { b: \"one\" }\n"
      "added: item[0]: { b: \"zero\" }\n",
      output);
}